

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::SubroutineIndexMixImplicit::Run(SubroutineIndexMixImplicit *this)

{
  long lVar1;
  UniformValueGenerator *generator;
  LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier> _index;
  DefOccurence local_5a4;
  LayoutSpecifierBase local_5a0;
  LayoutSpecifierBase local_590;
  SubroutineUniform local_580;
  undefined1 local_418 [8];
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  SubroutineFunction local_3d0;
  LayoutSpecifierBase local_2c8;
  LayoutSpecifierBase local_2b8;
  LayoutSpecifierBase local_2a8;
  SubroutineFunction local_298;
  LayoutSpecifierBase local_190;
  LayoutSpecifierBase local_180;
  LayoutSpecifierBase local_160;
  SubroutineFunction local_150;
  undefined1 local_48 [8];
  SubroutineFunctionSet functions_st0;
  SubroutineIndexMixImplicit *this_local;
  
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  functions_st0.typeName.field_2._8_8_ = this;
  SubroutineFunctionSet::SubroutineFunctionSet((SubroutineFunctionSet *)local_48,generator,0);
  local_190 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::Implicit();
  local_180 = local_190;
  local_160 = local_190;
  SubroutineFunction::SubroutineFunction(&local_150,generator,(Index)local_190);
  SubroutineFunctionSet::push_back((SubroutineFunctionSet *)local_48,&local_150);
  SubroutineFunction::~SubroutineFunction(&local_150);
  local_2c8 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::C(1,Dec);
  local_2b8 = local_2c8;
  local_2a8 = local_2c8;
  SubroutineFunction::SubroutineFunction
            (&local_298,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (Index)local_2c8);
  SubroutineFunctionSet::push_back((SubroutineFunctionSet *)local_48,&local_298);
  SubroutineFunction::~SubroutineFunction(&local_298);
  _index = LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::C(0,Dec);
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = _index.super_LayoutSpecifierBase._0_8_;
  SubroutineFunction::SubroutineFunction
            (&local_3d0,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (Index)_index.super_LayoutSpecifierBase);
  SubroutineFunctionSet::push_back((SubroutineFunctionSet *)local_48,&local_3d0);
  SubroutineFunction::~SubroutineFunction(&local_3d0);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
            *)local_418);
  local_5a0 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(2,Dec);
  local_590 = local_5a0;
  DefOccurence::DefOccurence(&local_5a4,FSH_OR_CSH);
  SubroutineUniform::SubroutineUniform
            (&local_580,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (SubroutineFunctionSet *)local_48,(Loc)local_590,0,local_5a4,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_418,&local_580);
  SubroutineUniform::~SubroutineUniform(&local_580);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      *)local_418);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
             *)local_418);
  SubroutineFunctionSet::~SubroutineFunctionSet((SubroutineFunctionSet *)local_48);
  return lVar1;
}

Assistant:

virtual long Run()
	{

		//subroutine vec4 st0(float param);
		SubroutineFunctionSet functions_st0(uniformValueGenerator);
		//subroutine(st0) vec4 sf0(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::Implicit()));
		//layout(index = 1) subroutine(st0) vec4 sf1(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(1)));
		//layout(index = 0) subroutine(st0) vec4 sf1(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(0)));

		std::vector<SubroutineUniform> subroutineUniforms;

		//layout(location = 2) subroutine uniform st0 u0;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(2), 0, DefOccurence::FSH_OR_CSH));
		return doRun(subroutineUniforms);
	}